

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_ext_substmt(lysp_yang_ctx *ctx,ly_stmt kw,char *word,size_t word_len,lysp_stmt **child)

{
  lysp_stmt *plVar1;
  LY_ERR LVar2;
  lysp_stmt *str_p;
  lysp_stmt *plVar3;
  char *pcVar4;
  ly_ctx *plVar5;
  bool bVar6;
  ly_stmt child_kw;
  size_t word_len_local;
  char *word_local;
  char *buf;
  
  word_len_local = word_len;
  word_local = word;
  str_p = (lysp_stmt *)calloc(1,0x38);
  if (str_p == (lysp_stmt *)0x0) {
    LVar2 = LY_EMEM;
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_ext_substmt");
  }
  else {
    plVar1 = *child;
    if (*child != (lysp_stmt *)0x0) {
      do {
        plVar3 = plVar1;
        plVar1 = plVar3->next;
      } while (plVar1 != (lysp_stmt *)0x0);
      child = &plVar3->next;
    }
    *child = str_p;
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar5 = (ly_ctx *)0x0;
    }
    else {
      plVar5 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar2 = lydict_insert(plVar5,word,word_len,(char **)str_p);
    if ((LVar2 == LY_SUCCESS) &&
       (LVar2 = get_argument(ctx,Y_MAYBE_STR_ARG,&str_p->flags,&word_local,&buf,&word_len_local),
       LVar2 == LY_SUCCESS)) {
      if (word_local != (char *)0x0) {
        if (buf == (char *)0x0) {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar5 = (ly_ctx *)0x0;
          }
          else {
            plVar5 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          pcVar4 = word_local;
          if (word_len_local == 0) {
            pcVar4 = "";
          }
          LVar2 = lydict_insert(plVar5,pcVar4,word_len_local,&str_p->arg);
        }
        else {
          if (ctx == (lysp_yang_ctx *)0x0) {
            plVar5 = (ly_ctx *)0x0;
          }
          else {
            plVar5 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          LVar2 = lydict_insert_zc(plVar5,word_local,&str_p->arg);
        }
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
      }
      str_p->format = LY_VALUE_SCHEMA;
      str_p->prefix_data = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      str_p->kw = kw;
      LVar2 = get_keyword(ctx,&child_kw,&word_local,&word_len_local);
      if (LVar2 == LY_SUCCESS) {
        if (child_kw == LY_STMT_SYNTAX_SEMICOLON) {
          bVar6 = true;
        }
        else {
          if (child_kw != LY_STMT_SYNTAX_LEFT_BRACE) {
            plVar5 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            pcVar4 = lyplg_ext_stmt2str(child_kw);
            ly_vlog(plVar5,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
            return LY_EVALID;
          }
          LVar2 = get_keyword(ctx,&child_kw,&word_local,&word_len_local);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          bVar6 = child_kw == LY_STMT_SYNTAX_RIGHT_BRACE;
        }
        while (!bVar6) {
          LVar2 = parse_ext_substmt(ctx,child_kw,word_local,word_len_local,&str_p->child);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          LVar2 = get_keyword(ctx,&child_kw,&word_local,&word_len_local);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          bVar6 = child_kw == LY_STMT_SYNTAX_RIGHT_BRACE;
        }
        LVar2 = LY_SUCCESS;
      }
    }
  }
  return LVar2;
}

Assistant:

static LY_ERR
parse_ext_substmt(struct lysp_yang_ctx *ctx, enum ly_stmt kw, char *word, size_t word_len,
        struct lysp_stmt **child)
{
    char *buf;
    LY_ERR ret = LY_SUCCESS;
    enum ly_stmt child_kw;
    struct lysp_stmt *stmt, *par_child;

    stmt = calloc(1, sizeof *stmt);
    LY_CHECK_ERR_RET(!stmt, LOGMEM(NULL), LY_EMEM);

    /* insert into parent statements */
    if (!*child) {
        *child = stmt;
    } else {
        for (par_child = *child; par_child->next; par_child = par_child->next) {}
        par_child->next = stmt;
    }

    /* statement */
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), word, word_len, &stmt->stmt));

    /* get optional argument */
    LY_CHECK_RET(get_argument(ctx, Y_MAYBE_STR_ARG, &stmt->flags, &word, &buf, &word_len));
    if (word) {
        INSERT_WORD_GOTO(ctx, buf, stmt->arg, word, word_len, ret, cleanup);
    }

    stmt->format = LY_VALUE_SCHEMA;
    stmt->prefix_data = PARSER_CUR_PMOD(ctx);
    stmt->kw = kw;

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, child_kw, word, word_len, ret, cleanup) {
        LY_CHECK_GOTO(ret = parse_ext_substmt(ctx, child_kw, word, word_len, &stmt->child), cleanup)
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, child_kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    return ret;
}